

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cEnhancedLayoutsTests.cpp
# Opt level: O2

double __thiscall
gl4cts::EnhancedLayouts::Utils::Shader::InvalidSourceException::log
          (InvalidSourceException *this,double __x)

{
  ostringstream *this_00;
  Context *in_RSI;
  double extraout_XMM0_Qa;
  undefined1 local_198 [384];
  
  local_198._0_8_ = in_RSI->m_testCtx->m_log;
  this_00 = (ostringstream *)(local_198 + 8);
  std::__cxx11::ostringstream::ostringstream(this_00);
  std::operator<<((ostream *)this_00,"Failed to compile shader: ");
  std::operator<<((ostream *)this_00,(this->m_message)._M_dataplus._M_p);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_198,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(this_00);
  LogSource(in_RSI,&this->m_source,this->m_stage);
  return extraout_XMM0_Qa;
}

Assistant:

void Shader::InvalidSourceException::log(deqp::Context& context) const
{
	context.getTestContext().getLog() << tcu::TestLog::Message << "Failed to compile shader: " << m_message.c_str()
									  << tcu::TestLog::EndMessage;

	LogSource(context, m_source, m_stage);
}